

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O1

UConverterSharedData * ucnv_load_63(UConverterLoadArgs *pArgs,UErrorCode *err)

{
  UConverterSharedData *pUVar1;
  UConverterSharedData *data;
  
  if ((err == (UErrorCode *)0x0) || (U_ZERO_ERROR < *err)) {
    pUVar1 = (UConverterSharedData *)0x0;
  }
  else {
    if ((pArgs->pkg != (char *)0x0) && (*pArgs->pkg != '\0')) {
      pUVar1 = createConverterFromFile(pArgs,err);
      return pUVar1;
    }
    if (SHARED_DATA_HASHTABLE == (UHashtable *)0x0) {
      pUVar1 = (UConverterSharedData *)0x0;
    }
    else {
      pUVar1 = (UConverterSharedData *)uhash_get_63(SHARED_DATA_HASHTABLE,pArgs->name);
    }
    if (pUVar1 == (UConverterSharedData *)0x0) {
      data = createConverterFromFile(pArgs,err);
      pUVar1 = (UConverterSharedData *)0x0;
      if (((data != (UConverterSharedData *)0x0) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) &&
         (pUVar1 = data, pArgs->onlyTestIsLoadable == '\0')) {
        ucnv_shareConverterData(data);
      }
    }
    else {
      pUVar1->referenceCounter = pUVar1->referenceCounter + 1;
    }
  }
  return pUVar1;
}

Assistant:

UConverterSharedData *
ucnv_load(UConverterLoadArgs *pArgs, UErrorCode *err) {
    UConverterSharedData *mySharedConverterData;

    if(err == NULL || U_FAILURE(*err)) {
        return NULL;
    }

    if(pArgs->pkg != NULL && *pArgs->pkg != 0) {
        /* application-provided converters are not currently cached */
        return createConverterFromFile(pArgs, err);
    }

    mySharedConverterData = ucnv_getSharedConverterData(pArgs->name);
    if (mySharedConverterData == NULL)
    {
        /*Not cached, we need to stream it in from file */
        mySharedConverterData = createConverterFromFile(pArgs, err);
        if (U_FAILURE (*err) || (mySharedConverterData == NULL))
        {
            return NULL;
        }
        else if (!pArgs->onlyTestIsLoadable)
        {
            /* share it with other library clients */
            ucnv_shareConverterData(mySharedConverterData);
        }
    }
    else
    {
        /* The data for this converter was already in the cache.            */
        /* Update the reference counter on the shared data: one more client */
        mySharedConverterData->referenceCounter++;
    }

    return mySharedConverterData;
}